

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O0

void sdf::RenderNormal(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps
                      ,float max_ray_length,float precision,
                      vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                      Mat *Normals)

{
  bool bVar1;
  bool bVar2;
  Scalar *pSVar3;
  float *pfVar4;
  Vec<float,_3> *pVVar5;
  int in_EDX;
  int in_ESI;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float fVar6;
  double dVar7;
  float in_XMM1_Da;
  Mat *in_stack_00000008;
  Vector3d normal_vector;
  double D_prev;
  int steps;
  double D;
  double scaling_prev;
  double scaling;
  Vector3d p;
  bool hit;
  int v;
  int u;
  Vector3d viewAxis;
  Vector3d camera;
  Mat Nmap;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  float in_stack_fffffffffffffc24;
  Vec<float,_3> *in_stack_fffffffffffffc28;
  EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffc30;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  Vec<float,_3> *in_stack_fffffffffffffc40;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  double *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc6c;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffc80;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives_00;
  int iVar8;
  int iVar9;
  int local_1ec;
  double local_1d8;
  int local_168;
  int local_164;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_fffffffffffffee0;
  Vector3d *in_stack_fffffffffffffee8;
  Mat local_90 [108];
  float local_24;
  float local_20;
  int local_1c;
  int local_10;
  int local_c;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *local_8;
  
  local_24 = in_XMM1_Da;
  local_20 = in_XMM0_Da;
  local_1c = in_R8D;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  cv::Mat::Mat(local_90,in_ESI,in_EDX,0x15);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (Scalar *)in_stack_fffffffffffffc48,(Scalar *)in_stack_fffffffffffffc40,
             (Scalar *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  Eigen::Transform<double,3,2,0>::operator*
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),in_stack_fffffffffffffc30
            );
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (Scalar *)in_stack_fffffffffffffc48,(Scalar *)in_stack_fffffffffffffc40,
             (Scalar *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  Eigen::Transform<double,3,2,0>::operator*
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),in_stack_fffffffffffffc30
            );
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffc48,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffc40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::normalized(in_stack_fffffffffffffc80);
  local_164 = 0;
  do {
    if (local_c <= local_164) {
      cv::Mat::operator=(in_stack_00000008,local_90);
      cv::Mat::~Mat(local_90);
      return;
    }
    for (local_168 = 0; local_168 < local_10; local_168 = local_168 + 1) {
      bVar1 = false;
      primitives_00 = local_8;
      iVar8 = local_164;
      iVar9 = local_168;
      Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Index)in_stack_fffffffffffffc18);
      Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Index)in_stack_fffffffffffffc18);
      Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Index)in_stack_fffffffffffffc18);
      Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Index)in_stack_fffffffffffffc18);
      makeRay((int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48,
              (float)((ulong)in_stack_fffffffffffffc40 >> 0x20),SUB84(in_stack_fffffffffffffc40,0),
              in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
              (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
      Eigen::Transform<double,3,2,0>::operator*
                ((Transform<double,_3,_2,_0> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 in_stack_fffffffffffffc30);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (in_stack_fffffffffffffc48,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffc40);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 in_stack_fffffffffffffc18);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffc28);
      local_1d8 = 0.4;
      local_1ec = 0;
      while( true ) {
        bVar2 = false;
        if ((local_1ec < local_1c) && (bVar2 = false, local_1d8 < (double)local_20)) {
          bVar2 = true;
        }
        if (!bVar2) goto LAB_00164d9a;
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                   in_stack_fffffffffffffc60);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                  (in_stack_fffffffffffffc48,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                    *)in_stack_fffffffffffffc40);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                    *)in_stack_fffffffffffffc18);
        dVar7 = SDF((Vector3d *)CONCAT44(iVar9,iVar8),primitives_00);
        if (dVar7 < (double)local_24) break;
        local_1d8 = dVar7 + local_1d8;
        local_1ec = local_1ec + 1;
      }
      bVar1 = true;
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 in_stack_fffffffffffffc60);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                (in_stack_fffffffffffffc48,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_fffffffffffffc40);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                  *)in_stack_fffffffffffffc18);
      SDFGradient(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffc28);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                          (Index)in_stack_fffffffffffffc18);
      dVar7 = *pSVar3;
      pVVar5 = cv::Mat::at<cv::Vec<float,3>>(local_90,local_164,local_168);
      pfVar4 = cv::Vec<float,_3>::operator[](pVVar5,1);
      *pfVar4 = (float)dVar7;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                          (Index)in_stack_fffffffffffffc18);
      dVar7 = *pSVar3;
      pVVar5 = cv::Mat::at<cv::Vec<float,3>>(local_90,local_164,local_168);
      pfVar4 = cv::Vec<float,_3>::operator[](pVVar5,2);
      *pfVar4 = (float)dVar7;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                          (Index)in_stack_fffffffffffffc18);
      in_stack_fffffffffffffc6c = (float)*pSVar3;
      pVVar5 = cv::Mat::at<cv::Vec<float,3>>(local_90,local_164,local_168);
      in_stack_fffffffffffffc60 = (double *)cv::Vec<float,_3>::operator[](pVVar5,0);
      *(float *)in_stack_fffffffffffffc60 = in_stack_fffffffffffffc6c;
LAB_00164d9a:
      if (!bVar1) {
        fVar6 = std::numeric_limits<float>::quiet_NaN();
        pVVar5 = cv::Mat::at<cv::Vec<float,3>>(local_90,local_164,local_168);
        in_stack_fffffffffffffc48 =
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             cv::Vec<float,_3>::operator[](pVVar5,0);
        *(float *)in_stack_fffffffffffffc48 = fVar6;
        in_stack_fffffffffffffc3c = std::numeric_limits<float>::quiet_NaN();
        in_stack_fffffffffffffc40 = cv::Mat::at<cv::Vec<float,3>>(local_90,local_164,local_168);
        in_stack_fffffffffffffc30 =
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             cv::Vec<float,_3>::operator[](in_stack_fffffffffffffc40,1);
        *(float *)in_stack_fffffffffffffc30 = in_stack_fffffffffffffc3c;
        in_stack_fffffffffffffc24 = std::numeric_limits<float>::quiet_NaN();
        in_stack_fffffffffffffc28 = cv::Mat::at<cv::Vec<float,3>>(local_90,local_164,local_168);
        in_stack_fffffffffffffc18 =
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)cv::Vec<float,_3>::operator[](in_stack_fffffffffffffc28,2);
        *(float *)in_stack_fffffffffffffc18 = in_stack_fffffffffffffc24;
      }
    }
    local_164 = local_164 + 1;
  } while( true );
}

Assistant:

void RenderNormal(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length, 
    const float precision, 
    std::vector<Primitive*> &primitives,
    cv::Mat &Normals)
  {
    
    cv::Mat Nmap(rows, cols, CV_32FC3);
    const Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
    const Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized(); 
    
    //Rendering loop
   #pragma omp parallel for collapse(2)
    for(int u = 0; u < rows; ++u)
    {
      for(int v = 0; v < cols; ++v)
      {
        bool hit = false;

        Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;
        p.normalize();
              
        double scaling = 0.4;
        double scaling_prev=0;
        double D = 1.0;
        int steps=0;
        while(steps<max_steps && scaling < max_ray_length && !hit)
        { 

          double D_prev = D;
          D = SDF(camera + p*scaling, primitives);
          if(D < precision)
          {
            scaling = scaling_prev + (scaling-scaling_prev)*D_prev/(D_prev - (D - precision));

            hit = true;
            Eigen::Vector3d normal_vector = SDFGradient(camera + p*scaling,primitives);            
            normal_vector.normalize();

            Nmap.at<cv::Vec3f>(u,v)[1]=(normal_vector(0));
            Nmap.at<cv::Vec3f>(u,v)[2]=(normal_vector(1));
            Nmap.at<cv::Vec3f>(u,v)[0]=(normal_vector(2));

            break;
          }
          scaling_prev = scaling;
          scaling += D;  
          ++steps;        
        }//ray
        if(!hit)     
        {
          Nmap.at<cv::Vec3f>(u,v)[0]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[1]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[2]=std::numeric_limits<float>::quiet_NaN();
        
        }//no hit
      }//col
    }//row 

    Normals = Nmap;
    return;
  }